

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::child_pos(Tree *this,size_t node,size_t ch)

{
  Tree *this_00;
  Tree *in_RDX;
  size_t in_RDI;
  size_t i;
  size_t count;
  Tree *in_stack_ffffffffffffffd0;
  size_t local_28;
  
  local_28 = 0;
  this_00 = (Tree *)first_child(in_stack_ffffffffffffffd0,in_RDI);
  while( true ) {
    if (this_00 == (Tree *)0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    if (this_00 == in_RDX) break;
    local_28 = local_28 + 1;
    this_00 = (Tree *)next_sibling(this_00,in_RDI);
  }
  return local_28;
}

Assistant:

size_t Tree::child_pos(size_t node, size_t ch) const
{
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(i == ch)
            return count;
        ++count;
    }
    return npos;
}